

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_large_dalloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  ulong in_RDX;
  long in_RSI;
  tsdn_t *in_RDI;
  szind_t hindex;
  szind_t index;
  szind_t ret;
  ulong local_40;
  ulong local_30;
  uint local_10;
  
  local_30 = in_RDX;
  if (in_RDX < 0x4000) {
    local_30 = 0x4000;
  }
  if (local_30 < 0x1001) {
    local_10 = (uint)sz_size2index_tab[local_30 + 7 >> 3];
  }
  else {
    local_10 = sz_size2index_compute(local_30);
  }
  if (local_10 < 0x24) {
    local_40 = 0;
  }
  else {
    local_40 = (ulong)local_10 - 0x24;
  }
  arena_stats_add_u64(in_RDI,(arena_stats_t *)(in_RSI + 0x18),
                      (arena_stats_u64_t *)(in_RSI + (local_40 & 0xffffffff) * 0x30 + 0x300),1);
  return;
}

Assistant:

static void
arena_large_dalloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	szind_t index, hindex;

	cassert(config_stats);

	if (usize < SC_LARGE_MINCLASS) {
		usize = SC_LARGE_MINCLASS;
	}
	index = sz_size2index(usize);
	hindex = (index >= SC_NBINS) ? index - SC_NBINS : 0;

	arena_stats_add_u64(tsdn, &arena->stats,
	    &arena->stats.lstats[hindex].ndalloc, 1);
}